

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O1

short * __thiscall EDPF::ComputePrewitt3x3(EDPF *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  size_t __n;
  long lVar5;
  short *__s;
  void *__s_00;
  int i;
  int iVar6;
  uchar *puVar7;
  uchar *puVar8;
  short *psVar9;
  uchar *puVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  
  iVar2 = (this->super_ED).width;
  lVar12 = (long)iVar2;
  iVar3 = (this->super_ED).height;
  lVar5 = iVar3 * lVar12;
  __n = lVar5 * 2;
  uVar11 = 0xffffffffffffffff;
  if (-1 < (int)lVar5) {
    uVar11 = __n;
  }
  __s = (short *)operator_new__(uVar11);
  memset(__s,0,__n);
  __s_00 = operator_new__(0x20000);
  memset(__s_00,0,0x20000);
  if (2 < (long)iVar3) {
    puVar10 = (this->super_ED).smoothImg;
    puVar7 = puVar10 + 2;
    puVar8 = puVar10 + lVar12 * 2 + 2;
    psVar9 = __s + lVar12 + 1;
    puVar10 = puVar10 + lVar12 + 2;
    uVar11 = 1;
    do {
      if (2 < iVar2) {
        lVar5 = 0;
        do {
          iVar13 = ((uint)puVar10[lVar5] + ((uint)puVar7[lVar5] - (uint)puVar8[lVar5 + -2]) +
                   ((uint)puVar8[lVar5] - (uint)puVar7[lVar5 + -2])) - (uint)puVar10[lVar5 + -2];
          iVar6 = -iVar13;
          if (0 < iVar13) {
            iVar6 = iVar13;
          }
          iVar14 = ((uint)puVar8[lVar5 + -1] + ((uint)puVar8[lVar5] - (uint)puVar7[lVar5 + -2])) -
                   ((uint)puVar7[lVar5 + -1] + ((uint)puVar7[lVar5] - (uint)puVar8[lVar5 + -2]));
          iVar13 = -iVar14;
          if (0 < iVar14) {
            iVar13 = iVar14;
          }
          piVar1 = (int *)((long)__s_00 + (ulong)(uint)(iVar13 + iVar6) * 4);
          *piVar1 = *piVar1 + 1;
          psVar9[lVar5] = (short)(iVar13 + iVar6);
          lVar5 = lVar5 + 1;
        } while ((ulong)(iVar2 - 1) - 1 != lVar5);
      }
      uVar11 = uVar11 + 1;
      puVar7 = puVar7 + lVar12;
      puVar8 = puVar8 + lVar12;
      psVar9 = psVar9 + lVar12;
      puVar10 = puVar10 + lVar12;
    } while (uVar11 != iVar3 - 1);
  }
  iVar6 = *(int *)((long)__s_00 + 0x1fffc);
  uVar11 = 0x8000;
  do {
    iVar6 = iVar6 + *(int *)((long)__s_00 + uVar11 * 4 + -8);
    *(int *)((long)__s_00 + uVar11 * 4 + -8) = iVar6;
    uVar11 = uVar11 - 1;
  } while (1 < uVar11);
  pdVar4 = this->H;
  lVar5 = 0;
  do {
    pdVar4[lVar5] =
         (double)*(int *)((long)__s_00 + lVar5 * 4) / (double)((iVar3 + -2) * (iVar2 + -2));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x8000);
  operator_delete__(__s_00);
  return __s;
}

Assistant:

short * EDPF::ComputePrewitt3x3()
{
	short *gradImg = new short[width*height];
	memset(gradImg, 0, sizeof(short)*width*height);

	int *grads = new int[MAX_GRAD_VALUE];
	memset(grads, 0, sizeof(int)*MAX_GRAD_VALUE);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
			int gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));

			int g = gx + gy;

			gradImg[i*width + j] = g;
			grads[g]++;
		} // end-for
	} //end-for

	 // Compute probability function H
	int size = (width - 2)*(height - 2);
	
	for (int i = MAX_GRAD_VALUE - 1; i>0; i--)
		grads[i - 1] += grads[i];
	
	for (int i = 0; i < MAX_GRAD_VALUE; i++)
		H[i] = (double)grads[i] / ((double)size);

	delete[] grads;
	return gradImg;
}